

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O3

int test_entities(void)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  xmlDocPtr pxVar10;
  long lVar11;
  xmlBufferPtr pxVar12;
  undefined8 uVar13;
  undefined4 uVar14;
  ulong uVar15;
  ulong *puVar16;
  int n_buf;
  ulong in_RSI;
  ulong uVar17;
  ulong uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  uint uVar21;
  undefined8 *puVar22;
  int n_content;
  uint uVar23;
  int n_content_1;
  int test_ret_2;
  int test_ret_1;
  int test_ret_3;
  int test_ret_4;
  int test_ret;
  int test_ret_9;
  int test_ret_8;
  uint local_60;
  int local_5c;
  int local_44;
  int local_38;
  int local_34;
  
  if (quiet == '\0') {
    puts("Testing entities : 11 of 17 functions ...");
  }
  local_44 = 0;
  local_60 = 0;
  do {
    uVar21 = 0;
    do {
      uVar1 = 0;
      do {
        uVar4 = 0;
        do {
          uVar15 = 0;
          do {
            puVar22 = &DAT_00162d68;
            uVar17 = 0;
            do {
              iVar3 = (int)in_RSI;
              iVar2 = xmlMemBlocks();
              pxVar10 = gen_xmlDocPtr(local_60,iVar3);
              if (uVar21 < 4) {
                in_RSI = (&DAT_00162d68)[uVar21];
              }
              else {
                in_RSI = 0;
              }
              uVar14 = 0xffffffff;
              if (uVar1 < 4) {
                uVar14 = (&DAT_0015fd14)[uVar1];
              }
              if (uVar4 < 4) {
                uVar13 = (&DAT_00162d68)[uVar4];
              }
              else {
                uVar13 = 0;
              }
              if ((uint)uVar15 < 4) {
                uVar19 = (&DAT_00162d68)[uVar15];
              }
              else {
                uVar19 = 0;
              }
              uVar23 = (uint)uVar17;
              if (uVar23 < 4) {
                uVar20 = *puVar22;
              }
              else {
                uVar20 = 0;
              }
              lVar11 = xmlAddDocEntity(pxVar10,in_RSI,uVar14,uVar13,uVar19,uVar20);
              if (lVar11 != 0) {
                xmlUnlinkNode(lVar11);
                xmlFreeNode(lVar11);
              }
              call_tests = call_tests + 1;
              if (((pxVar10 != (xmlDocPtr)0x0) && (api_doc != pxVar10)) && (pxVar10->doc != api_doc)
                 ) {
                xmlFreeDoc(pxVar10);
              }
              xmlResetLastError();
              iVar3 = xmlMemBlocks();
              if (iVar2 != iVar3) {
                iVar3 = xmlMemBlocks();
                printf("Leak of %d blocks found in xmlAddDocEntity",(ulong)(uint)(iVar3 - iVar2));
                local_44 = local_44 + 1;
                printf(" %d",(ulong)local_60);
                printf(" %d",(ulong)uVar21);
                printf(" %d",(ulong)uVar1);
                printf(" %d",(ulong)uVar4);
                printf(" %d",uVar15);
                printf(" %d");
                putchar(10);
                in_RSI = uVar17;
              }
              uVar23 = uVar23 + 1;
              uVar17 = (ulong)uVar23;
              puVar22 = puVar22 + 1;
            } while (uVar23 != 5);
            uVar23 = (uint)uVar15 + 1;
            uVar15 = (ulong)uVar23;
          } while (uVar23 != 5);
          uVar4 = uVar4 + 1;
        } while (uVar4 != 5);
        uVar1 = uVar1 + 1;
      } while (uVar1 != 4);
      uVar21 = uVar21 + 1;
    } while (uVar21 != 5);
    local_60 = local_60 + 1;
  } while (local_60 != 4);
  function_tests = function_tests + 1;
  local_5c = 0;
  local_60 = 0;
  do {
    uVar21 = 0;
    do {
      uVar1 = 0;
      do {
        uVar4 = 0;
        do {
          uVar15 = 0;
          do {
            puVar22 = &DAT_00162d68;
            uVar17 = 0;
            do {
              iVar3 = (int)in_RSI;
              iVar2 = xmlMemBlocks();
              pxVar10 = gen_xmlDocPtr(local_60,iVar3);
              if (uVar21 < 4) {
                in_RSI = (&DAT_00162d68)[uVar21];
              }
              else {
                in_RSI = 0;
              }
              uVar14 = 0xffffffff;
              if (uVar1 < 4) {
                uVar14 = (&DAT_0015fd14)[uVar1];
              }
              if (uVar4 < 4) {
                uVar13 = (&DAT_00162d68)[uVar4];
              }
              else {
                uVar13 = 0;
              }
              if ((uint)uVar15 < 4) {
                uVar19 = (&DAT_00162d68)[uVar15];
              }
              else {
                uVar19 = 0;
              }
              uVar23 = (uint)uVar17;
              if (uVar23 < 4) {
                uVar20 = *puVar22;
              }
              else {
                uVar20 = 0;
              }
              lVar11 = xmlAddDtdEntity(pxVar10,in_RSI,uVar14,uVar13,uVar19,uVar20);
              if (lVar11 != 0) {
                xmlUnlinkNode(lVar11);
                xmlFreeNode(lVar11);
              }
              call_tests = call_tests + 1;
              if (((pxVar10 != (xmlDocPtr)0x0) && (api_doc != pxVar10)) && (pxVar10->doc != api_doc)
                 ) {
                xmlFreeDoc(pxVar10);
              }
              xmlResetLastError();
              iVar3 = xmlMemBlocks();
              if (iVar2 != iVar3) {
                iVar3 = xmlMemBlocks();
                printf("Leak of %d blocks found in xmlAddDtdEntity",(ulong)(uint)(iVar3 - iVar2));
                local_5c = local_5c + 1;
                printf(" %d",(ulong)local_60);
                printf(" %d",(ulong)uVar21);
                printf(" %d",(ulong)uVar1);
                printf(" %d",(ulong)uVar4);
                printf(" %d",uVar15);
                printf(" %d");
                putchar(10);
                in_RSI = uVar17;
              }
              uVar23 = uVar23 + 1;
              uVar17 = (ulong)uVar23;
              puVar22 = puVar22 + 1;
            } while (uVar23 != 5);
            uVar23 = (uint)uVar15 + 1;
            uVar15 = (ulong)uVar23;
          } while (uVar23 != 5);
          uVar4 = uVar4 + 1;
        } while (uVar4 != 5);
        uVar1 = uVar1 + 1;
      } while (uVar1 != 4);
      uVar21 = uVar21 + 1;
    } while (uVar21 != 5);
    local_60 = local_60 + 1;
  } while (local_60 != 4);
  function_tests = function_tests + 1;
  local_60 = 0;
  iVar2 = 0;
  do {
    iVar5 = (int)in_RSI;
    iVar3 = xmlMemBlocks();
    pxVar12 = gen_xmlBufferPtr(iVar2,iVar5);
    in_RSI = 0;
    xmlDumpEntitiesTable(pxVar12);
    call_tests = call_tests + 1;
    if (pxVar12 != (xmlBufferPtr)0x0) {
      xmlBufferFree(pxVar12);
    }
    xmlResetLastError();
    iVar5 = xmlMemBlocks();
    if (iVar3 != iVar5) {
      iVar5 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlDumpEntitiesTable",(ulong)(uint)(iVar5 - iVar3));
      local_60 = local_60 + 1;
      printf(" %d");
      in_RSI = 0;
      printf(" %d");
      putchar(10);
    }
    iVar2 = iVar2 + 1;
  } while (iVar2 != 3);
  function_tests = function_tests + 1;
  iVar2 = 0;
  iVar3 = 0;
  do {
    iVar6 = (int)in_RSI;
    iVar5 = xmlMemBlocks();
    pxVar12 = gen_xmlBufferPtr(iVar3,iVar6);
    in_RSI = 0;
    xmlDumpEntityDecl(pxVar12);
    call_tests = call_tests + 1;
    if (pxVar12 != (xmlBufferPtr)0x0) {
      xmlBufferFree(pxVar12);
    }
    xmlResetLastError();
    iVar6 = xmlMemBlocks();
    if (iVar5 != iVar6) {
      iVar6 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlDumpEntityDecl",(ulong)(uint)(iVar6 - iVar5));
      iVar2 = iVar2 + 1;
      printf(" %d");
      in_RSI = 0;
      printf(" %d");
      putchar(10);
    }
    iVar3 = iVar3 + 1;
  } while (iVar3 != 3);
  function_tests = function_tests + 1;
  iVar3 = 0;
  uVar21 = 0;
  do {
    puVar16 = &DAT_00162d68;
    uVar15 = 0;
    do {
      iVar6 = (int)in_RSI;
      iVar5 = xmlMemBlocks();
      pxVar10 = gen_xmlDocPtr(uVar21,iVar6);
      uVar1 = (uint)uVar15;
      if (uVar1 < 4) {
        in_RSI = *puVar16;
      }
      else {
        in_RSI = 0;
      }
      lVar11 = xmlEncodeEntitiesReentrant(pxVar10);
      if (lVar11 != 0) {
        (*_xmlFree)(lVar11);
      }
      call_tests = call_tests + 1;
      if (((pxVar10 != (xmlDocPtr)0x0) && (api_doc != pxVar10)) && (pxVar10->doc != api_doc)) {
        xmlFreeDoc(pxVar10);
      }
      xmlResetLastError();
      iVar6 = xmlMemBlocks();
      if (iVar5 != iVar6) {
        iVar6 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlEncodeEntitiesReentrant",(ulong)(uint)(iVar6 - iVar5))
        ;
        iVar3 = iVar3 + 1;
        printf(" %d",(ulong)uVar21);
        printf(" %d");
        putchar(10);
        in_RSI = uVar15;
      }
      uVar1 = uVar1 + 1;
      uVar15 = (ulong)uVar1;
      puVar16 = puVar16 + 1;
    } while (uVar1 != 5);
    uVar21 = uVar21 + 1;
  } while (uVar21 != 4);
  iVar5 = local_5c + local_44 + local_60;
  function_tests = function_tests + 1;
  iVar6 = 0;
  local_60 = 0;
  do {
    iVar7 = xmlMemBlocks();
    lVar11 = xmlEncodeSpecialChars(0);
    if (lVar11 != 0) {
      (*_xmlFree)();
    }
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar8 = xmlMemBlocks();
    if (iVar7 != iVar8) {
      iVar8 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlEncodeSpecialChars",(ulong)(uint)(iVar8 - iVar7));
      local_60 = local_60 + 1;
      printf(" %d",0);
      printf(" %d");
      putchar(10);
    }
    iVar6 = iVar6 + 1;
  } while (iVar6 != 5);
  function_tests = function_tests + 1;
  puVar16 = &DAT_00162d68;
  uVar21 = 0;
  iVar6 = 0;
  do {
    iVar7 = xmlMemBlocks();
    if (uVar21 < 4) {
      uVar15 = *puVar16;
    }
    else {
      uVar15 = 0;
    }
    lVar11 = xmlGetDocEntity(0);
    if (lVar11 != 0) {
      xmlUnlinkNode(lVar11);
      xmlFreeNode();
    }
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar8 = xmlMemBlocks();
    if (iVar7 != iVar8) {
      iVar8 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlGetDocEntity",(ulong)(uint)(iVar8 - iVar7));
      iVar6 = iVar6 + 1;
      printf(" %d",0);
      uVar15 = (ulong)uVar21;
      printf(" %d");
      putchar(10);
    }
    uVar21 = uVar21 + 1;
    puVar16 = puVar16 + 1;
  } while (uVar21 != 5);
  function_tests = function_tests + 1;
  iVar7 = 0;
  uVar21 = 0;
  do {
    puVar16 = &DAT_00162d68;
    uVar17 = 0;
    do {
      iVar9 = (int)uVar15;
      iVar8 = xmlMemBlocks();
      pxVar10 = gen_xmlDocPtr(uVar21,iVar9);
      uVar1 = (uint)uVar17;
      if (uVar1 < 4) {
        uVar15 = *puVar16;
      }
      else {
        uVar15 = 0;
      }
      lVar11 = xmlGetDtdEntity(pxVar10);
      if (lVar11 != 0) {
        xmlUnlinkNode(lVar11);
        xmlFreeNode(lVar11);
      }
      call_tests = call_tests + 1;
      if (((pxVar10 != (xmlDocPtr)0x0) && (api_doc != pxVar10)) && (pxVar10->doc != api_doc)) {
        xmlFreeDoc(pxVar10);
      }
      xmlResetLastError();
      iVar9 = xmlMemBlocks();
      if (iVar8 != iVar9) {
        iVar9 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlGetDtdEntity",(ulong)(uint)(iVar9 - iVar8));
        iVar7 = iVar7 + 1;
        printf(" %d",(ulong)uVar21);
        printf(" %d");
        putchar(10);
        uVar15 = uVar17;
      }
      uVar1 = uVar1 + 1;
      uVar17 = (ulong)uVar1;
      puVar16 = puVar16 + 1;
    } while (uVar1 != 5);
    uVar21 = uVar21 + 1;
  } while (uVar21 != 4);
  iVar2 = iVar5 + iVar2 + iVar3 + local_60;
  function_tests = function_tests + 1;
  local_34 = 0;
  uVar21 = 0;
  do {
    puVar16 = &DAT_00162d68;
    uVar17 = 0;
    do {
      iVar5 = (int)uVar15;
      iVar3 = xmlMemBlocks();
      pxVar10 = gen_xmlDocPtr(uVar21,iVar5);
      uVar1 = (uint)uVar17;
      if (uVar1 < 4) {
        uVar15 = *puVar16;
      }
      else {
        uVar15 = 0;
      }
      lVar11 = xmlGetParameterEntity(pxVar10);
      if (lVar11 != 0) {
        xmlUnlinkNode(lVar11);
        xmlFreeNode(lVar11);
      }
      call_tests = call_tests + 1;
      if (((pxVar10 != (xmlDocPtr)0x0) && (api_doc != pxVar10)) && (pxVar10->doc != api_doc)) {
        xmlFreeDoc(pxVar10);
      }
      xmlResetLastError();
      iVar5 = xmlMemBlocks();
      if (iVar3 != iVar5) {
        iVar5 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlGetParameterEntity",(ulong)(uint)(iVar5 - iVar3));
        local_34 = local_34 + 1;
        printf(" %d",(ulong)uVar21);
        printf(" %d");
        putchar(10);
        uVar15 = uVar17;
      }
      uVar1 = uVar1 + 1;
      uVar17 = (ulong)uVar1;
      puVar16 = puVar16 + 1;
    } while (uVar1 != 5);
    uVar21 = uVar21 + 1;
  } while (uVar21 != 4);
  function_tests = function_tests + 1;
  puVar22 = &DAT_00162d68;
  uVar21 = 0;
  local_38 = 0;
  do {
    iVar3 = xmlMemBlocks();
    if (uVar21 < 4) {
      uVar13 = *puVar22;
    }
    else {
      uVar13 = 0;
    }
    lVar11 = xmlGetPredefinedEntity(uVar13);
    if (lVar11 != 0) {
      xmlUnlinkNode(lVar11);
      xmlFreeNode();
    }
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar5 = xmlMemBlocks();
    if (iVar3 != iVar5) {
      iVar5 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlGetPredefinedEntity",(ulong)(uint)(iVar5 - iVar3));
      local_38 = local_38 + 1;
      uVar15 = (ulong)uVar21;
      printf(" %d");
      putchar(10);
    }
    uVar21 = uVar21 + 1;
    puVar22 = puVar22 + 1;
  } while (uVar21 != 5);
  function_tests = function_tests + 1;
  local_44 = 0;
  local_60 = 0;
  do {
    uVar21 = 0;
    do {
      uVar1 = 0;
      do {
        uVar4 = 0;
        do {
          uVar17 = 0;
          do {
            puVar22 = &DAT_00162d68;
            uVar18 = 0;
            do {
              iVar5 = (int)uVar15;
              iVar3 = xmlMemBlocks();
              pxVar10 = gen_xmlDocPtr(local_60,iVar5);
              if (uVar21 < 4) {
                uVar15 = (&DAT_00162d68)[uVar21];
              }
              else {
                uVar15 = 0;
              }
              uVar14 = 0xffffffff;
              if (uVar1 < 4) {
                uVar14 = (&DAT_0015fd14)[uVar1];
              }
              if (uVar4 < 4) {
                uVar13 = (&DAT_00162d68)[uVar4];
              }
              else {
                uVar13 = 0;
              }
              if ((uint)uVar17 < 4) {
                uVar19 = (&DAT_00162d68)[uVar17];
              }
              else {
                uVar19 = 0;
              }
              uVar23 = (uint)uVar18;
              if (uVar23 < 4) {
                uVar20 = *puVar22;
              }
              else {
                uVar20 = 0;
              }
              lVar11 = xmlNewEntity(pxVar10,uVar15,uVar14,uVar13,uVar19,uVar20);
              if (lVar11 != 0) {
                xmlUnlinkNode(lVar11);
                xmlFreeNode(lVar11);
              }
              call_tests = call_tests + 1;
              if (((pxVar10 != (xmlDocPtr)0x0) && (api_doc != pxVar10)) && (pxVar10->doc != api_doc)
                 ) {
                xmlFreeDoc(pxVar10);
              }
              xmlResetLastError();
              iVar5 = xmlMemBlocks();
              if (iVar3 != iVar5) {
                iVar5 = xmlMemBlocks();
                printf("Leak of %d blocks found in xmlNewEntity",(ulong)(uint)(iVar5 - iVar3));
                local_44 = local_44 + 1;
                printf(" %d",(ulong)local_60);
                printf(" %d",(ulong)uVar21);
                printf(" %d",(ulong)uVar1);
                printf(" %d",(ulong)uVar4);
                printf(" %d",uVar17);
                printf(" %d");
                putchar(10);
                uVar15 = uVar18;
              }
              uVar23 = uVar23 + 1;
              uVar18 = (ulong)uVar23;
              puVar22 = puVar22 + 1;
            } while (uVar23 != 5);
            uVar23 = (uint)uVar17 + 1;
            uVar17 = (ulong)uVar23;
          } while (uVar23 != 5);
          uVar4 = uVar4 + 1;
        } while (uVar4 != 5);
        uVar1 = uVar1 + 1;
      } while (uVar1 != 4);
      uVar21 = uVar21 + 1;
    } while (uVar21 != 5);
    local_60 = local_60 + 1;
  } while (local_60 != 4);
  function_tests = function_tests + 1;
  uVar21 = iVar2 + iVar6 + iVar7 + local_34 + local_38 + local_44;
  if (uVar21 != 0) {
    printf("Module entities: %d errors\n",(ulong)uVar21);
  }
  return uVar21;
}

Assistant:

static int
test_entities(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing entities : 11 of 17 functions ...\n");
    test_ret += test_xmlAddDocEntity();
    test_ret += test_xmlAddDtdEntity();
    test_ret += test_xmlCopyEntitiesTable();
    test_ret += test_xmlCreateEntitiesTable();
    test_ret += test_xmlDumpEntitiesTable();
    test_ret += test_xmlDumpEntityDecl();
    test_ret += test_xmlEncodeEntitiesReentrant();
    test_ret += test_xmlEncodeSpecialChars();
    test_ret += test_xmlGetDocEntity();
    test_ret += test_xmlGetDtdEntity();
    test_ret += test_xmlGetParameterEntity();
    test_ret += test_xmlGetPredefinedEntity();
    test_ret += test_xmlNewEntity();

    if (test_ret != 0)
	printf("Module entities: %d errors\n", test_ret);
    return(test_ret);
}